

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_lazy_dedicatedDictSearch_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  uint uVar3;
  char cVar4;
  undefined8 uVar5;
  seqStore_t *psVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  seqDef *psVar12;
  uint uVar13;
  int iVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  int *ip;
  int *piVar17;
  ulong uVar18;
  int *piVar19;
  U32 UVar20;
  U32 UVar21;
  ulong uVar22;
  BYTE *litEnd;
  ulong uVar23;
  int *ip_00;
  BYTE *pBVar24;
  long lVar25;
  size_t ofbCandidate;
  uint local_e8;
  U32 local_e4;
  U32 local_e0;
  uint local_dc;
  BYTE *local_d8;
  ulong local_d0;
  int *local_c8;
  uint local_bc;
  BYTE *local_b8;
  BYTE *local_b0;
  int *local_a8;
  BYTE *litLimit_w;
  BYTE *local_98;
  int local_8c;
  int local_88;
  int local_84;
  int *local_80;
  BYTE *local_78;
  BYTE *local_70;
  seqStore_t *local_68;
  U32 *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  int *local_40;
  ulong local_38;
  
  local_d8 = (ms->window).base;
  uVar9 = (ms->window).dictLimit;
  local_d0 = (ulong)uVar9;
  local_b8 = local_d8 + local_d0;
  local_dc = (ms->cParams).minMatch;
  if (5 < local_dc) {
    local_dc = 6;
  }
  if (local_dc < 5) {
    local_dc = 4;
  }
  local_bc = (ms->cParams).searchLog;
  local_e8 = 6;
  if (local_bc < 6) {
    local_e8 = local_bc;
  }
  if (local_e8 < 5) {
    local_e8 = 4;
  }
  pZVar2 = ms->dictMatchState;
  local_98 = (pZVar2->window).base;
  local_78 = local_98 + (pZVar2->window).dictLimit;
  local_b0 = (pZVar2->window).nextSrc;
  iVar7 = (int)local_b0;
  local_e4 = *rep;
  UVar21 = rep[1];
  ms->lazySkipping = 0;
  local_a8 = (int *)((long)src + (srcSize - 0x10));
  uVar8 = ms->nextToUpdate;
  uVar23 = (ulong)uVar8;
  uVar13 = ((int)local_a8 - (int)(local_d8 + uVar23)) + 1;
  if (7 < uVar13) {
    uVar13 = 8;
  }
  uVar3 = 0;
  if (local_d8 + uVar23 <= local_a8) {
    uVar3 = uVar13;
  }
  cVar4 = (char)ms->rowHashLog;
  iEnd = (BYTE *)((long)src + srcSize);
  for (; uVar23 < uVar3 + uVar8; uVar23 = uVar23 + 1) {
    if (local_dc == 5) {
      uVar22 = *(long *)(local_d8 + uVar23) * -0x30e4432345000000;
LAB_01f6c1cb:
      UVar20 = (U32)((uVar22 ^ ms->hashSalt) >> (0x38U - cVar4 & 0x3f));
    }
    else {
      if (local_dc == 6) {
        uVar22 = *(long *)(local_d8 + uVar23) * -0x30e4432340650000;
        goto LAB_01f6c1cb;
      }
      UVar20 = (*(int *)(local_d8 + uVar23) * -0x61c8864f ^ (uint)ms->hashSalt) >>
               (0x18U - cVar4 & 0x1f);
    }
    ms->hashCache[(uint)uVar23 & 7] = UVar20;
  }
  local_38 = (ulong)(((int)local_98 - iVar7) + uVar9);
  ip = (int *)((ulong)(((int)src - ((int)local_b8 + (int)local_78)) + iVar7 == 0) + (long)src);
  pBVar24 = local_98 + -local_38;
  litLimit_w = iEnd + -0x20;
  iVar14 = (int)local_d8;
  local_84 = (1 - uVar9) - iVar14;
  local_8c = -iVar14;
  local_88 = (((iVar7 - uVar9) - (int)local_98) - iVar14) + 1;
  local_68 = seqStore;
  local_60 = rep;
  do {
    while( true ) {
      local_e0 = UVar21;
      uVar9 = local_dc;
      if (local_a8 <= ip) {
        *local_60 = local_e4;
        local_60[1] = local_e0;
        return (long)iEnd - (long)src;
      }
      local_c8 = (int *)((long)ip + 1);
      iVar7 = (int)ip;
      uVar8 = ((iVar7 - (int)local_d8) - local_e4) + 1;
      piVar19 = (int *)(local_d8 + uVar8);
      if (uVar8 < (uint)local_d0) {
        piVar19 = (int *)(local_98 + (uVar8 - (int)local_38));
      }
      if ((uVar8 - (uint)local_d0 < 0xfffffffd) && (*piVar19 == *local_c8)) {
        pBVar15 = iEnd;
        if (uVar8 < (uint)local_d0) {
          pBVar15 = local_b0;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)ip + 5),(BYTE *)(piVar19 + 1),iEnd,pBVar15,local_b8);
        uVar23 = sVar10 + 4;
      }
      else {
        uVar23 = 0;
      }
      ofbCandidate = 999999999;
      if (uVar9 == 6) {
        if (local_e8 == 6) {
          uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6(ms,(BYTE *)ip,iEnd,&ofbCandidate);
        }
        else if (local_e8 == 5) {
          uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5(ms,(BYTE *)ip,iEnd,&ofbCandidate);
        }
        else {
          uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4(ms,(BYTE *)ip,iEnd,&ofbCandidate);
        }
      }
      else if (uVar9 == 5) {
        if (local_e8 == 6) {
          uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6(ms,(BYTE *)ip,iEnd,&ofbCandidate);
        }
        else if (local_e8 == 5) {
          uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5(ms,(BYTE *)ip,iEnd,&ofbCandidate);
        }
        else {
          uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4(ms,(BYTE *)ip,iEnd,&ofbCandidate);
        }
      }
      else if (local_e8 == 6) {
        uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      else if (local_e8 == 5) {
        uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      else {
        uVar22 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      uVar11 = uVar23;
      if (uVar23 < uVar22) {
        uVar11 = uVar22;
      }
      if (3 < uVar11) break;
      uVar23 = (long)ip - (long)src;
      ip = (int *)((long)ip + (uVar23 >> 8) + 1);
      ms->lazySkipping = (uint)(0x7ff < uVar23);
      UVar21 = local_e0;
    }
    uVar18 = 1;
    if (uVar23 < uVar22) {
      local_c8 = ip;
      uVar18 = ofbCandidate;
    }
    local_48 = (ulong)((local_84 - local_e4) + iVar7);
    local_50 = (ulong)((local_8c - local_e4) + iVar7);
    local_58 = (ulong)((local_88 - local_e4) + iVar7);
    piVar19 = ip;
    local_80 = (int *)src;
    local_70 = pBVar24;
    for (lVar25 = 0; uVar23 = uVar11, (int *)((long)ip + lVar25) < local_a8; lVar25 = lVar25 + 1) {
      ip_00 = (int *)((long)ip + lVar25 + 1);
      iVar7 = (int)lVar25;
      uVar9 = (int)local_50 + iVar7 + 1;
      piVar17 = (int *)(local_d8 + uVar9);
      if (uVar9 < (uint)local_d0) {
        piVar17 = (int *)(local_98 + (uint)((int)local_58 + iVar7));
      }
      local_40 = piVar19;
      if (((uint)((int)local_48 + iVar7) < 0xfffffffd) && (*piVar17 == *ip_00)) {
        pBVar24 = iEnd;
        if (uVar9 < (uint)local_d0) {
          pBVar24 = local_b0;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)ip + lVar25 + 5),(BYTE *)(piVar17 + 1),iEnd,pBVar24,
                            local_b8);
        if (sVar10 < 0xfffffffffffffffc) {
          uVar9 = 0x1f;
          if ((uint)uVar18 != 0) {
            for (; (uint)uVar18 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          if ((int)((uVar9 ^ 0x1f) + (int)uVar11 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
            uVar18 = 1;
            uVar23 = sVar10 + 4;
            local_c8 = ip_00;
          }
        }
      }
      ofbCandidate = 999999999;
      if (local_dc == 6) {
        if (local_e8 == 6) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
        }
        else if (local_e8 == 5) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
        }
      }
      else if (local_dc == 5) {
        if (local_e8 == 6) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
        }
        else if (local_e8 == 5) {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
        }
        else {
          uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
        }
      }
      else if (local_e8 == 6) {
        uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
      }
      else if (local_e8 == 5) {
        uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
      }
      else {
        uVar11 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4(ms,(BYTE *)ip_00,iEnd,&ofbCandidate);
      }
      if (uVar11 < 4) break;
      uVar9 = 0x1f;
      if ((uint)uVar18 != 0) {
        for (; (uint)uVar18 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      iVar7 = 0x1f;
      if ((uint)ofbCandidate != 0) {
        for (; (uint)ofbCandidate >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      if ((int)uVar11 * 4 - iVar7 <= (int)((uVar9 ^ 0x1f) + (int)uVar23 * 4 + -0x1b)) break;
      piVar19 = (int *)((long)local_40 + 1);
      uVar18 = ofbCandidate;
      local_c8 = piVar19;
    }
    psVar6 = local_68;
    pBVar24 = local_70;
    if (3 < uVar18) {
      uVar22 = (long)local_c8 + (-(long)local_d8 - uVar18) + -0xfffffffd;
      pBVar16 = local_d8;
      pBVar15 = local_b8;
      if ((uint)uVar22 < (uint)local_d0) {
        pBVar16 = local_70;
        pBVar15 = local_78;
      }
      pBVar16 = pBVar16 + (uVar22 & 0xffffffff);
      for (; ((local_80 < local_c8 && (pBVar15 < pBVar16)) &&
             (*(BYTE *)((long)local_c8 + -1) == pBVar16[-1]));
          local_c8 = (int *)((long)local_c8 + -1)) {
        pBVar16 = pBVar16 + -1;
        uVar23 = uVar23 + 1;
      }
      local_e0 = local_e4;
      local_e4 = (U32)uVar18 - 3;
    }
    uVar22 = (long)local_c8 - (long)local_80;
    pBVar15 = local_68->lit;
    if (litLimit_w < local_c8) {
      ZSTD_safecopyLiterals(pBVar15,(BYTE *)local_80,(BYTE *)local_c8,litLimit_w);
LAB_01f6c735:
      psVar6->lit = psVar6->lit + uVar22;
      psVar12 = psVar6->sequences;
      if (0xffff < uVar22) {
        psVar6->longLengthType = ZSTD_llt_literalLength;
        psVar6->longLengthPos = (U32)((ulong)((long)psVar12 - (long)psVar6->sequencesStart) >> 3);
      }
    }
    else {
      uVar5 = *(undefined8 *)(local_80 + 2);
      *(undefined8 *)pBVar15 = *(undefined8 *)local_80;
      *(undefined8 *)(pBVar15 + 8) = uVar5;
      pBVar15 = local_68->lit;
      if (0x10 < uVar22) {
        uVar5 = *(undefined8 *)(local_80 + 6);
        *(undefined8 *)(pBVar15 + 0x10) = *(undefined8 *)(local_80 + 4);
        *(undefined8 *)(pBVar15 + 0x18) = uVar5;
        if (0x20 < (long)uVar22) {
          lVar25 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_80 + lVar25 + 0x20);
            uVar5 = puVar1[1];
            pBVar16 = pBVar15 + lVar25 + 0x20;
            *(undefined8 *)pBVar16 = *puVar1;
            *(undefined8 *)(pBVar16 + 8) = uVar5;
            puVar1 = (undefined8 *)((long)local_80 + lVar25 + 0x30);
            uVar5 = puVar1[1];
            *(undefined8 *)(pBVar16 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar16 + 0x18) = uVar5;
            lVar25 = lVar25 + 0x20;
          } while (pBVar16 + 0x20 < pBVar15 + uVar22);
        }
        goto LAB_01f6c735;
      }
      local_68->lit = pBVar15 + uVar22;
      psVar12 = local_68->sequences;
    }
    psVar12->litLength = (U16)uVar22;
    psVar12->offBase = (U32)uVar18;
    if (0xffff < uVar23 - 3) {
      psVar6->longLengthType = ZSTD_llt_matchLength;
      psVar6->longLengthPos = (U32)((ulong)((long)psVar12 - (long)psVar6->sequencesStart) >> 3);
    }
    psVar12->mlBase = (U16)(uVar23 - 3);
    psVar6->sequences = psVar12 + 1;
    if (ms->lazySkipping != 0) {
      uVar9 = ms->nextToUpdate;
      uVar22 = (ulong)uVar9;
      uVar8 = ((int)local_a8 - (int)(local_d8 + uVar22)) + 1;
      if (7 < uVar8) {
        uVar8 = 8;
      }
      if (local_a8 < local_d8 + uVar22) {
        uVar8 = 0;
      }
      cVar4 = (char)ms->rowHashLog;
      for (; uVar22 < uVar8 + uVar9; uVar22 = uVar22 + 1) {
        if (local_dc == 5) {
          uVar11 = *(long *)(local_d8 + uVar22) * -0x30e4432345000000;
LAB_01f6c8b1:
          UVar21 = (U32)((uVar11 ^ ms->hashSalt) >> (0x38U - cVar4 & 0x3f));
        }
        else {
          if (local_dc == 6) {
            uVar11 = *(long *)(local_d8 + uVar22) * -0x30e4432340650000;
            goto LAB_01f6c8b1;
          }
          UVar21 = (*(int *)(local_d8 + uVar22) * -0x61c8864f ^ (uint)ms->hashSalt) >>
                   (0x18U - cVar4 & 0x1f);
        }
        ms->hashCache[(uint)uVar22 & 7] = UVar21;
      }
      ms->lazySkipping = 0;
    }
    UVar20 = local_e0;
    for (ip = (int *)((long)local_c8 + uVar23); UVar21 = UVar20, src = ip, ip <= local_a8;
        ip = (int *)((long)ip + sVar10 + 4)) {
      uVar9 = ((int)ip - (int)local_d8) - UVar21;
      pBVar15 = local_d8;
      if (uVar9 < (uint)local_d0) {
        pBVar15 = pBVar24;
      }
      if ((0xfffffffc < uVar9 - (uint)local_d0) || (*(int *)(pBVar15 + uVar9) != *ip)) break;
      pBVar16 = iEnd;
      if (uVar9 < (uint)local_d0) {
        pBVar16 = local_b0;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar15 + uVar9) + 4),iEnd,pBVar16,
                          local_b8);
      pBVar15 = psVar6->lit;
      if (litLimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar15,(BYTE *)ip,(BYTE *)ip,litLimit_w);
      }
      else {
        uVar5 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar15 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar15 + 8) = uVar5;
      }
      psVar12 = psVar6->sequences;
      psVar12->litLength = 0;
      psVar12->offBase = 1;
      if (0xffff < sVar10 + 1) {
        psVar6->longLengthType = ZSTD_llt_matchLength;
        psVar6->longLengthPos = (U32)((ulong)((long)psVar12 - (long)psVar6->sequencesStart) >> 3);
      }
      psVar12->mlBase = (U16)(sVar10 + 1);
      psVar6->sequences = psVar12 + 1;
      UVar20 = local_e4;
      local_e4 = UVar21;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1, ZSTD_dedicatedDictSearch);
}